

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O2

void ex_dzdetect(expr *expr)

{
  uint uVar1;
  char *pcVar2;
  
  if (expr->exp_error != 0) {
    return;
  }
  uVar1 = expr->exp_flags;
  if ((uVar1 & 6) == 0) {
    pcVar2 = "expr";
  }
  else if ((uVar1 & 5) == 0) {
    pcVar2 = "expr~";
  }
  else if ((uVar1 & 3) == 0) {
    pcVar2 = "fexpr~";
  }
  else {
    post("expr -- ex_dzdetect internal error");
    pcVar2 = "";
  }
  post("%s divide by zero detected",pcVar2);
  *(byte *)&expr->exp_error = (byte)expr->exp_error | 1;
  return;
}

Assistant:

void
ex_dzdetect(struct expr *expr)
{
        char *etype;

        if ((!expr->exp_error) & EE_DZ) {
                if (IS_EXPR(expr))
                        etype = "expr";
                else if (IS_EXPR_TILDE(expr))
                        etype = "expr~";
                else if (IS_FEXPR_TILDE(expr))
                        etype = "fexpr~";
                else {
                        post ("expr -- ex_dzdetect internal error");
                        etype = "";
                }
                post ("%s divide by zero detected", etype);
                expr->exp_error |= EE_DZ;
        }
}